

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMeshNormals(CXMeshFileLoader *this,SXMesh *mesh)

{
  bool bVar1;
  u32 uVar2;
  u32 uVar3;
  uint uVar4;
  u32 uVar5;
  unsigned_short *puVar6;
  S3DVertex *pSVar7;
  vector3d<float> *pvVar8;
  uint *puVar9;
  long in_RSI;
  stringc *in_RDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  u32 jk;
  u32 h_1;
  u32 normalnum;
  u32 h;
  u32 indexcount;
  u32 triangles;
  u32 fcnt;
  u32 k;
  array<unsigned_int> polygonfaces;
  u32 normalidx;
  u32 nFNormals;
  array<unsigned_int> normalIndices;
  u32 i;
  array<irr::core::vector3d<float>_> normals;
  u32 nNormals;
  undefined4 in_stack_fffffffffffffe48;
  u32 in_stack_fffffffffffffe4c;
  CXMeshFileLoader *in_stack_fffffffffffffe50;
  CXMeshFileLoader *in_stack_fffffffffffffe58;
  vector3d<float> *in_stack_fffffffffffffe68;
  uint number;
  CXMeshFileLoader *in_stack_fffffffffffffe70;
  CXMeshFileLoader *in_stack_fffffffffffffe78;
  CXMeshFileLoader *in_stack_fffffffffffffea8;
  uint local_114;
  uint local_110;
  uint local_108;
  uint local_d4;
  uint local_64;
  bool local_1;
  
  bVar1 = readHeadOfDataObject(in_stack_fffffffffffffea8,in_RDI);
  uVar4 = (uint)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if (bVar1) {
    uVar2 = readInt(in_stack_fffffffffffffe58);
    core::array<irr::core::vector3d<float>_>::array
              ((array<irr::core::vector3d<float>_> *)in_stack_fffffffffffffe50);
    core::array<irr::core::vector3d<float>_>::set_used
              ((array<irr::core::vector3d<float>_> *)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe4c);
    for (local_64 = 0; local_64 < uVar2; local_64 = local_64 + 1) {
      core::array<irr::core::vector3d<float>_>::operator[]
                ((array<irr::core::vector3d<float>_> *)in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe4c);
      readVector3(in_stack_fffffffffffffe50,
                  (vector3df *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    }
    bVar1 = checkForTwoFollowingSemicolons(in_stack_fffffffffffffe78);
    if (!bVar1) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Normals Array found in x file",
                       __x_01);
      core::string<char>::string
                ((string<char> *)in_stack_fffffffffffffe70,
                 (uint)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      core::string<char>::c_str((string<char> *)0x2e689d);
      os::Printer::log(__x_02);
      core::string<char>::~string((string<char> *)0x2e68be);
    }
    core::array<unsigned_int>::array((array<unsigned_int> *)in_stack_fffffffffffffe50);
    core::array<unsigned_int>::size((array<unsigned_int> *)0x2e68df);
    core::array<unsigned_int>::set_used
              ((array<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    uVar2 = readInt(in_stack_fffffffffffffe58);
    core::array<unsigned_int>::array((array<unsigned_int> *)in_stack_fffffffffffffe50);
    for (local_d4 = 0; uVar4 = (uint)((ulong)in_stack_fffffffffffffe68 >> 0x20), local_d4 < uVar2;
        local_d4 = local_d4 + 1) {
      uVar3 = readInt(in_stack_fffffffffffffe58);
      uVar4 = (uVar3 - 2) * 3;
      puVar6 = core::array<unsigned_short>::operator[]
                         ((array<unsigned_short> *)in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe4c);
      number = (uint)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      if (uVar4 != *puVar6) {
        os::Printer::log((Printer *)"Not matching normal and face index count found in x file",
                         __x_03);
        core::string<char>::string((string<char> *)in_stack_fffffffffffffe70,number);
        core::string<char>::c_str((string<char> *)0x2e69cb);
        os::Printer::log(__x_04);
        core::string<char>::~string((string<char> *)0x2e69ec);
        in_RDI[2].str.field_2._M_local_buf[0] = '\x01';
        local_1 = false;
        goto LAB_002e6deb;
      }
      if (uVar4 == 3) {
        for (local_108 = 0; local_108 < 3; local_108 = local_108 + 1) {
          readInt(in_stack_fffffffffffffe58);
          core::array<unsigned_int>::operator[]
                    ((array<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          pSVar7 = core::array<irr::video::S3DVertex>::operator[]
                             ((array<irr::video::S3DVertex> *)in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4c);
          pvVar8 = core::array<irr::core::vector3d<float>_>::operator[]
                             ((array<irr::core::vector3d<float>_> *)in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4c);
          core::vector3d<float>::set(&pSVar7->Normal,pvVar8);
        }
      }
      else {
        core::array<unsigned_int>::set_used
                  ((array<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        for (local_110 = 0; local_110 < uVar3; local_110 = local_110 + 1) {
          uVar5 = readInt(in_stack_fffffffffffffe58);
          puVar9 = core::array<unsigned_int>::operator[]
                             ((array<unsigned_int> *)in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4c);
          *puVar9 = uVar5;
        }
        for (local_114 = 0; local_114 < uVar3 - 2; local_114 = local_114 + 1) {
          in_stack_fffffffffffffe50 = (CXMeshFileLoader *)(in_RSI + 0x70);
          core::array<unsigned_int>::operator[]
                    ((array<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          pSVar7 = core::array<irr::video::S3DVertex>::operator[]
                             ((array<irr::video::S3DVertex> *)in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4c);
          in_stack_fffffffffffffe58 = (CXMeshFileLoader *)&pSVar7->Normal;
          core::array<unsigned_int>::operator[]
                    ((array<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          pvVar8 = core::array<irr::core::vector3d<float>_>::operator[]
                             ((array<irr::core::vector3d<float>_> *)in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4c);
          core::vector3d<float>::set((vector3d<float> *)in_stack_fffffffffffffe58,pvVar8);
          core::array<unsigned_int>::operator[]
                    ((array<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          pSVar7 = core::array<irr::video::S3DVertex>::operator[]
                             ((array<irr::video::S3DVertex> *)in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4c);
          in_stack_fffffffffffffe68 = &pSVar7->Normal;
          core::array<unsigned_int>::operator[]
                    ((array<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          pvVar8 = core::array<irr::core::vector3d<float>_>::operator[]
                             ((array<irr::core::vector3d<float>_> *)in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4c);
          core::vector3d<float>::set(in_stack_fffffffffffffe68,pvVar8);
          in_stack_fffffffffffffe70 = (CXMeshFileLoader *)(in_RSI + 0x70);
          core::array<unsigned_int>::operator[]
                    ((array<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          pSVar7 = core::array<irr::video::S3DVertex>::operator[]
                             ((array<irr::video::S3DVertex> *)in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4c);
          in_stack_fffffffffffffe78 = (CXMeshFileLoader *)&pSVar7->Normal;
          core::array<unsigned_int>::operator[]
                    ((array<unsigned_int> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
          pvVar8 = core::array<irr::core::vector3d<float>_>::operator[]
                             ((array<irr::core::vector3d<float>_> *)in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4c);
          core::vector3d<float>::set((vector3d<float> *)in_stack_fffffffffffffe78,pvVar8);
        }
      }
    }
    bVar1 = checkForTwoFollowingSemicolons(in_stack_fffffffffffffe78);
    if (!bVar1) {
      os::Printer::log((Printer *)
                       "No finishing semicolon in Mesh Face Normals Array found in x file",__x_05);
      core::string<char>::string((string<char> *)in_stack_fffffffffffffe70,uVar4);
      core::string<char>::c_str((string<char> *)0x2e6d40);
      os::Printer::log(__x_06);
      core::string<char>::~string((string<char> *)0x2e6d61);
    }
    bVar1 = checkForClosingBrace(in_stack_fffffffffffffe70);
    if (bVar1) {
      local_1 = true;
    }
    else {
      os::Printer::log((Printer *)"No closing brace in Mesh Normals found in x file",__x_07);
      core::string<char>::string((string<char> *)in_stack_fffffffffffffe70,uVar4);
      core::string<char>::c_str((string<char> *)0x2e6d9c);
      os::Printer::log(__x_08);
      core::string<char>::~string((string<char> *)0x2e6dba);
      in_RDI[2].str.field_2._M_local_buf[0] = '\x01';
      local_1 = false;
    }
LAB_002e6deb:
    core::array<unsigned_int>::~array((array<unsigned_int> *)0x2e6df8);
    core::array<unsigned_int>::~array((array<unsigned_int> *)0x2e6e05);
    core::array<irr::core::vector3d<float>_>::~array((array<irr::core::vector3d<float>_> *)0x2e6e12)
    ;
  }
  else {
    os::Printer::log((Printer *)"No opening brace in Mesh Normals found in x file",__x);
    core::string<char>::string((string<char> *)in_stack_fffffffffffffe70,uVar4);
    core::string<char>::c_str((string<char> *)0x2e67a4);
    os::Printer::log(__x_00);
    core::string<char>::~string((string<char> *)0x2e67c5);
    in_RDI[2].str.field_2._M_local_buf[0] = '\x01';
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMeshNormals(SXMesh &mesh)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading mesh normals", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Mesh Normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read count
	const u32 nNormals = readInt();
	core::array<core::vector3df> normals;
	normals.set_used(nNormals);

	// read normals
	for (u32 i = 0; i < nNormals; ++i)
		readVector3(normals[i]);

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Normals Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	core::array<u32> normalIndices;
	normalIndices.set_used(mesh.Indices.size());

	// read face normal indices
	const u32 nFNormals = readInt();
	// if (nFNormals >= mesh.IndexCountPerFace.size())
	if (0) { // this condition doesn't work for some reason
		os::Printer::log("Too many face normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	u32 normalidx = 0;
	core::array<u32> polygonfaces;
	for (u32 k = 0; k < nFNormals; ++k) {
		const u32 fcnt = readInt();
		u32 triangles = fcnt - 2;
		u32 indexcount = triangles * 3;

		if (indexcount != mesh.IndexCountPerFace[k]) {
			os::Printer::log("Not matching normal and face index count found in x file", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		}

		if (indexcount == 3) {
			// default, only one triangle in this face
			for (u32 h = 0; h < 3; ++h) {
				const u32 normalnum = readInt();
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[normalnum]);
			}
		} else {
			polygonfaces.set_used(fcnt);
			// multiple triangles in this face
			for (u32 h = 0; h < fcnt; ++h)
				polygonfaces[h] = readInt();

			for (u32 jk = 0; jk < triangles; ++jk) {
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[0]]);
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[jk + 1]]);
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[jk + 2]]);
			}
		}
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Face Normals Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in Mesh Normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	return true;
}